

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  long lVar3;
  undefined8 uVar4;
  int *piVar5;
  uint uVar6;
  char **ppcVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  char *__format;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar11;
  ulong uVar12;
  size_t __size;
  int format;
  int align;
  ulong uVar13;
  bool bVar14;
  uchar *dstBuf;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  if (1 < argc) {
    uVar11 = 1;
    do {
      pcVar10 = argv[uVar11];
      iVar1 = strcasecmp(pcVar10,"-yuv");
      piVar5 = &doYUV;
      if (iVar1 != 0) {
        iVar1 = strcasecmp(pcVar10,"-noyuvpad");
        piVar5 = &pad;
        if (iVar1 != 0) {
          iVar1 = strcasecmp(pcVar10,"-alloc");
          piVar5 = &alloc;
          if (iVar1 != 0) {
            iVar1 = strcasecmp(pcVar10,"-bmp");
            if (iVar1 != 0) {
              printf("\nUSAGE: %s [options]\n\n",*argv);
              puts("Options:");
              puts("-yuv = test YUV encoding/decoding support");
              puts("-noyuvpad = do not pad each line of each Y, U, and V plane to the nearest");
              puts("            4-byte boundary");
              puts("-alloc = test automatic buffer allocation");
              puts("-bmp = tjLoadImage()/tjSaveImage() unit test\n");
              exit(1);
            }
            uVar11 = 1;
            do {
              ppcVar7 = pixFormatStr;
              lVar2 = 0;
              do {
                uVar6 = (uint)uVar11;
                printf("%s Top-Down BMP (row alignment = %d bytes)  ...  ",*ppcVar7,uVar11);
                align = (int)lVar2;
                iVar1 = doBmpTest("bmp",uVar6,align,0,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                printf("%s Top-Down PPM (row alignment = %d bytes)  ...  ",*ppcVar7,uVar11);
                iVar1 = doBmpTest("ppm",uVar6,align,2,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                printf("%s Bottom-Up BMP (row alignment = %d bytes)  ...  ",*ppcVar7,uVar11);
                iVar1 = doBmpTest("bmp",uVar6,align,0,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                printf("%s Bottom-Up PPM (row alignment = %d bytes)  ...  ",*ppcVar7,uVar11);
                iVar1 = doBmpTest("ppm",uVar6,align,2,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                lVar2 = lVar2 + 1;
                ppcVar7 = ppcVar7 + 1;
              } while (lVar2 != 0xc);
              uVar11 = (ulong)(uVar6 * 2);
              if (4 < uVar6) {
                return 0;
              }
            } while( true );
          }
        }
      }
      *piVar5 = 1;
      uVar11 = uVar11 + 1;
    } while ((uint)argc != uVar11);
  }
  if (alloc != 0) {
    puts("Testing automatic buffer allocation");
  }
  iVar1 = (doYUV == 0) + 4;
  uVar11 = tjBufSize(0x6883,0x6883,0);
  if (uVar11 < 0xffffffff) {
    pcVar10 = "tjBufSize() overflow";
  }
  else {
    uVar11 = TJBUFSIZE(0x6883,0x6883);
    if (uVar11 < 0xffffffff) {
      pcVar10 = "TJBUFSIZE() overflow";
    }
    else {
      uVar11 = tjBufSizeYUV2(0x93ce,1,0x93ce,0);
      if (uVar11 < 0xffffffff) {
        pcVar10 = "tjBufSizeYUV2() overflow";
      }
      else {
        uVar11 = TJBUFSIZEYUV(0x93ce,0x93ce,0);
        if (uVar11 < 0xffffffff) {
          pcVar10 = "TJBUFSIZEYUV() overflow";
        }
        else {
          uVar11 = tjBufSizeYUV(0x93ce,0x93ce,0);
          if (uVar11 < 0xffffffff) {
            pcVar10 = "tjBufSizeYUV() overflow";
          }
          else {
            uVar11 = tjPlaneSizeYUV(0,0x10000,0,0x10000);
            if (0xfffffffe < uVar11) goto LAB_001026df;
            pcVar10 = "tjPlaneSizeYUV() overflow";
          }
        }
      }
    }
  }
  printf("ERROR: %s\n",pcVar10);
  exitStatus = -1;
LAB_001026df:
  doTest(0x23,0x27,_3byteFormats,2,0,"test");
  doTest(0x27,0x29,_4byteFormats,iVar1,0,"test");
  doTest(0x29,0x23,_3byteFormats,2,1,"test");
  doTest(0x23,0x27,_4byteFormats,iVar1,1,"test");
  doTest(0x27,0x29,_3byteFormats,2,2,"test");
  doTest(0x29,0x23,_4byteFormats,iVar1,2,"test");
  doTest(0x23,0x27,_3byteFormats,2,4,"test");
  doTest(0x27,0x29,_4byteFormats,iVar1,4,"test");
  doTest(0x29,0x23,_3byteFormats,2,5,"test");
  doTest(0x23,0x27,_4byteFormats,iVar1,5,"test");
  doTest(0x27,0x29,_onlyGray,1,3,"test");
  doTest(0x29,0x23,_3byteFormats,2,3,"test");
  doTest(0x23,0x27,_4byteFormats,4,3,"test");
  dstBuf = (uchar *)0x0;
  local_58 = 0;
  lVar2 = tjInitCompress();
  if (lVar2 == 0) {
    uVar4 = tjGetErrorStr();
    __ptr = (void *)0x0;
    printf("TurboJPEG ERROR:\n%s\n",uVar4);
    exitStatus = -1;
  }
  else {
    puts("Buffer size regression test");
    uVar6 = 0;
    do {
      uVar11 = (ulong)uVar6;
      uVar12 = 1;
      lVar8 = 4;
      local_50 = uVar11;
      do {
        local_48 = 0x30;
        if (uVar12 == 1) {
          local_48 = 0x800;
        }
        local_40 = uVar12 * 4;
        bVar14 = true;
        uVar13 = 1;
        local_60 = lVar8;
        do {
          lVar9 = lVar8 + (ulong)(lVar8 == 0);
          local_38 = lVar8;
          if (((uint)((int)uVar13 * -0x3d70a3d7) >> 2 | (int)uVar13 * 0x40000000) < 0x28f5c29) {
            printf("%.4d x %.4d\b\b\b\b\b\b\b\b\b\b\b",uVar12,uVar13 & 0xffffffff);
          }
          __size = uVar13 * local_40;
          __ptr = malloc(__size);
          if (__ptr == (void *)0x0) {
LAB_00102bf0:
            printf("ERROR: %s\n","Memory allocation failure");
            __ptr = (void *)0x0;
            lVar9 = local_60;
LAB_00102c39:
            exitStatus = -1;
            goto LAB_00102c47;
          }
          if (doYUV != 0 || alloc == 0) {
            if (doYUV == 0) {
              local_58 = tjBufSize(uVar12,uVar13 & 0xffffffff,uVar11 & 0xffffffff);
            }
            else {
              local_58 = tjBufSizeYUV2(uVar12,pad,uVar13 & 0xffffffff,uVar11 & 0xffffffff);
            }
            dstBuf = (uchar *)tjAlloc(local_58 & 0xffffffff);
            if (dstBuf != (uchar *)0x0) goto LAB_001029a9;
LAB_00102c1b:
            __format = "ERROR: %s\n";
            pcVar10 = "Memory allocation failure";
LAB_00102c29:
            printf(__format,pcVar10);
            lVar9 = local_60;
            goto LAB_00102c39;
          }
LAB_001029a9:
          lVar8 = 0;
          do {
            lVar3 = random();
            uVar11 = local_50;
            *(char *)((long)__ptr + lVar8) = -(0x3ffffffe < lVar3);
            lVar8 = lVar8 + 1;
          } while (lVar9 != lVar8);
          if (doYUV == 0) {
            iVar1 = tjCompress2(lVar2,__ptr,uVar12,0,uVar13 & 0xffffffff,3,&dstBuf,&local_58,
                                local_50,100,(ulong)(alloc == 0) << 10);
          }
          else {
            iVar1 = tjEncodeYUV3(lVar2,__ptr,uVar12,0,uVar13 & 0xffffffff,3,dstBuf,pad,local_50,0);
          }
          if (iVar1 == -1) {
            pcVar10 = (char *)tjGetErrorStr();
            __format = "TurboJPEG ERROR:\n%s\n";
            goto LAB_00102c29;
          }
          free(__ptr);
          if ((alloc == 0) || (doYUV != 0)) {
            tjFree(dstBuf);
            dstBuf = (uchar *)0x0;
          }
          __ptr = malloc(__size);
          if (__ptr == (void *)0x0) goto LAB_00102bf0;
          if (doYUV != 0 || alloc == 0) {
            if (doYUV == 0) {
              local_58 = tjBufSize(uVar13 & 0xffffffff,uVar12,uVar11 & 0xffffffff);
            }
            else {
              local_58 = tjBufSizeYUV2(uVar13 & 0xffffffff,pad,uVar12,uVar11 & 0xffffffff);
            }
            dstBuf = (uchar *)tjAlloc(local_58 & 0xffffffff);
            if (dstBuf == (uchar *)0x0) goto LAB_00102c1b;
          }
          lVar8 = 0;
          do {
            lVar3 = random();
            *(char *)((long)__ptr + lVar8) = -(0x3ffffffe < lVar3);
            lVar8 = lVar8 + 1;
          } while (lVar9 != lVar8);
          if (doYUV == 0) {
            iVar1 = tjCompress2(lVar2,__ptr,uVar13 & 0xffffffff,0,uVar12 & 0xffffffff,3,&dstBuf,
                                &local_58,uVar11,100,(ulong)(alloc == 0) << 10);
          }
          else {
            iVar1 = tjEncodeYUV3(lVar2,__ptr,uVar13 & 0xffffffff,0,uVar12 & 0xffffffff,3,dstBuf,pad,
                                 uVar11,0);
          }
          lVar9 = local_60;
          if (iVar1 == -1) {
            uVar4 = tjGetErrorStr();
            printf("TurboJPEG ERROR:\n%s\n",uVar4);
            goto LAB_00102c39;
          }
          free(__ptr);
          if ((alloc == 0) || (doYUV != 0)) {
            tjFree(dstBuf);
            dstBuf = (uchar *)0x0;
          }
          uVar13 = uVar13 + 1;
          lVar8 = local_38 + lVar9;
          bVar14 = uVar13 < local_48;
        } while (uVar13 != local_48);
        __ptr = (void *)0x0;
LAB_00102c47:
        if (bVar14) goto LAB_00102cb2;
        uVar12 = uVar12 + 1;
        lVar8 = lVar9 + 4;
      } while (uVar12 != 0x30);
      uVar6 = (int)uVar11 + 1;
    } while (uVar6 != 6);
    puts("Done.      ");
  }
LAB_00102cb2:
  free(__ptr);
  tjFree(dstBuf);
  if (lVar2 != 0) {
    tjDestroy(lVar2);
  }
  if (doYUV != 0) {
    puts("\n--------------------\n");
    doTest(0x30,0x30,_onlyRGB,1,0,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,1,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,2,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,4,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,5,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,3,"test_yuv0");
    doTest(0x30,0x30,_onlyGray,1,3,"test_yuv0");
  }
  return exitStatus;
}

Assistant:

int main(int argc, char *argv[])
{
  int i, num4bf = 5;

#ifdef _WIN32
  srand((unsigned int)time(NULL));
#endif
  if (argc > 1) {
    for (i = 1; i < argc; i++) {
      if (!strcasecmp(argv[i], "-yuv")) doYUV = 1;
      else if (!strcasecmp(argv[i], "-noyuvpad")) pad = 1;
      else if (!strcasecmp(argv[i], "-alloc")) alloc = 1;
      else if (!strcasecmp(argv[i], "-bmp")) return bmpTest();
      else usage(argv[0]);
    }
  }
  if (alloc) printf("Testing automatic buffer allocation\n");
  if (doYUV) num4bf = 4;
  overflowTest();
  doTest(35, 39, _3byteFormats, 2, TJSAMP_444, "test");
  doTest(39, 41, _4byteFormats, num4bf, TJSAMP_444, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_422, "test");
  doTest(35, 39, _4byteFormats, num4bf, TJSAMP_422, "test");
  doTest(39, 41, _3byteFormats, 2, TJSAMP_420, "test");
  doTest(41, 35, _4byteFormats, num4bf, TJSAMP_420, "test");
  doTest(35, 39, _3byteFormats, 2, TJSAMP_440, "test");
  doTest(39, 41, _4byteFormats, num4bf, TJSAMP_440, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_411, "test");
  doTest(35, 39, _4byteFormats, num4bf, TJSAMP_411, "test");
  doTest(39, 41, _onlyGray, 1, TJSAMP_GRAY, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_GRAY, "test");
  doTest(35, 39, _4byteFormats, 4, TJSAMP_GRAY, "test");
  bufSizeTest();
  if (doYUV) {
    printf("\n--------------------\n\n");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_444, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_422, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_420, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_440, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_411, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_GRAY, "test_yuv0");
    doTest(48, 48, _onlyGray, 1, TJSAMP_GRAY, "test_yuv0");
  }

  return exitStatus;
}